

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger get_slice_params(HSQUIRRELVM v,SQInteger *sidx,SQInteger *eidx,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQInteger SVar4;
  SQObjectPtr *pSVar5;
  SQObjectValue SVar6;
  SQTable *pSVar7;
  
  SVar4 = sq_gettop(v);
  *sidx = 0;
  *eidx = 0;
  pSVar5 = SQVM::GetAt(v,v->_stackbase);
  SVar2 = (o->super_SQObject)._type;
  pSVar7 = (o->super_SQObject)._unVal.pTable;
  (o->super_SQObject)._unVal = (pSVar5->super_SQObject)._unVal;
  SVar3 = (pSVar5->super_SQObject)._type;
  (o->super_SQObject)._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  if (1 < SVar4) {
    pSVar5 = SQVM::GetAt(v,v->_stackbase + 1);
    SVar2 = (pSVar5->super_SQObject)._type;
    if ((SVar2 >> 0x1a & 1) != 0) {
      if (SVar2 == OT_FLOAT) {
        SVar6.nInteger = (SQInteger)(pSVar5->super_SQObject)._unVal.fFloat;
      }
      else {
        SVar6 = (pSVar5->super_SQObject)._unVal;
      }
      *sidx = (SQInteger)SVar6;
    }
  }
  if (SVar4 < 3) {
    pSVar7 = (SQTable *)sq_getsize(v,1);
  }
  else {
    pSVar5 = SQVM::GetAt(v,v->_stackbase + 2);
    SVar2 = (pSVar5->super_SQObject)._type;
    if ((SVar2 >> 0x1a & 1) == 0) {
      return (SQInteger)pSVar5;
    }
    if (SVar2 == OT_FLOAT) {
      pSVar7 = (SQTable *)(long)(pSVar5->super_SQObject)._unVal.fFloat;
    }
    else {
      pSVar7 = (pSVar5->super_SQObject)._unVal.pTable;
    }
  }
  *eidx = (SQInteger)pSVar7;
  return (SQInteger)pSVar7;
}

Assistant:

static SQInteger get_slice_params(HSQUIRRELVM v,SQInteger &sidx,SQInteger &eidx,SQObjectPtr &o)
{
    SQInteger top = sq_gettop(v);
    sidx=0;
    eidx=0;
    o=stack_get(v,1);
    if(top>1){
        SQObjectPtr &start=stack_get(v,2);
        if(sq_type(start)!=OT_NULL && sq_isnumeric(start)){
            sidx=tointeger(start);
        }
    }
    if(top>2){
        SQObjectPtr &end=stack_get(v,3);
        if(sq_isnumeric(end)){
            eidx=tointeger(end);
        }
    }
    else {
        eidx = sq_getsize(v,1);
    }
    return 1;
}